

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O3

symbol * copy_symbol(dmr_C *C,position pos,symbol *sym)

{
  symbol *psVar1;
  char *pcVar2;
  
  if (sym != (symbol *)0x0) {
    psVar1 = sym;
    if (((*(uint *)((long)&sym->field_14 + 0x18) & 0x84000c) == 0) &&
       (psVar1 = sym->replace, sym->replace == (symbol *)0x0)) {
      pcVar2 = dmrC_show_ident(C,sym->ident);
      dmrC_warning(C,pos,"unreplaced symbol \'%s\'",pcVar2);
      psVar1 = sym;
    }
    return psVar1;
  }
  return (symbol *)0x0;
}

Assistant:

static struct symbol *copy_symbol(struct dmr_C *C, struct position pos, struct symbol *sym)
{
	if (!sym)
		return sym;
	if (sym->ctype.modifiers & (MOD_STATIC | MOD_EXTERN | MOD_TOPLEVEL | MOD_INLINE))
		return sym;
	if (!sym->replace) {
		dmrC_warning(C, pos, "unreplaced symbol '%s'", dmrC_show_ident(C, sym->ident));
		return sym;
	}
	return sym->replace;
}